

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int porterCreate(int argc,char **argv,sqlite3_tokenizer **ppTokenizer)

{
  sqlite3_tokenizer *__s;
  porter_tokenizer *t;
  sqlite3_tokenizer **ppTokenizer_local;
  char **argv_local;
  int argc_local;
  
  __s = (sqlite3_tokenizer *)sqlite3_malloc(8);
  if (__s == (sqlite3_tokenizer *)0x0) {
    argv_local._4_4_ = 7;
  }
  else {
    memset(__s,0,8);
    *ppTokenizer = __s;
    argv_local._4_4_ = 0;
  }
  return argv_local._4_4_;
}

Assistant:

static int porterCreate(
  int argc, const char * const *argv,
  sqlite3_tokenizer **ppTokenizer
){
  porter_tokenizer *t;

  UNUSED_PARAMETER(argc);
  UNUSED_PARAMETER(argv);

  t = (porter_tokenizer *) sqlite3_malloc(sizeof(*t));
  if( t==NULL ) return SQLITE_NOMEM;
  memset(t, 0, sizeof(*t));
  *ppTokenizer = &t->base;
  return SQLITE_OK;
}